

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void anon_unknown.dwarf_118622::encodeUtf8(string *dest,char32_t character)

{
  byte bVar1;
  char32_t character_local;
  string *dest_local;
  
  bVar1 = (byte)character;
  if ((uint)character < 0x80) {
    std::__cxx11::string::operator+=((string *)dest,bVar1 & 0x7f);
  }
  else if ((uint)character < 0x800) {
    std::__cxx11::string::operator+=((string *)dest,(byte)((uint)character >> 6) & 0x1f | 0xc0);
    std::__cxx11::string::operator+=((string *)dest,bVar1 & 0x3f | 0x80);
  }
  else {
    std::__cxx11::string::operator+=((string *)dest,(byte)((uint)character >> 0xc) & 0xf | 0xe0);
    std::__cxx11::string::operator+=((string *)dest,(byte)((uint)character >> 6) & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)dest,bVar1 & 0x3f | 0x80);
  }
  return;
}

Assistant:

void encodeUtf8(std::string &dest, char32_t character)
	{
		if (character < 0x80)
		{
			dest += character & 0x7F;
		}
		else if (character < 0x800)
		{
			dest += 0xC0 | ((character >> 6) & 0x1F);
			dest += (0x80 | (character & 0x3F));
		}
		else
		{
			dest += 0xE0 | ((character >> 12) & 0xF);
			dest += 0x80 | ((character >> 6) & 0x3F);
			dest += 0x80 | (character & 0x3F);
		}
	}